

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

void __thiscall
OpenMD::ZConstraintForceModifier::calcTotalMassMovingZMols(ZConstraintForceModifier *this)

{
  bool bVar1;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *in_RDI;
  RealType RVar2;
  iterator i;
  _Self local_20;
  _List_node_base *local_18;
  iterator this_00;
  
  in_RDI[10].super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  std::_List_iterator<OpenMD::ZconstraintMol>::_List_iterator
            ((_List_iterator<OpenMD::ZconstraintMol> *)&stack0xfffffffffffffff0);
  local_18 = (_List_node_base *)
             std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
             begin(in_RDI);
  this_00 = (iterator)local_18;
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                   (in_RDI);
    bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffff0,&local_20);
    if (!bVar1) break;
    std::_List_iterator<OpenMD::ZconstraintMol>::operator->
              ((_List_iterator<OpenMD::ZconstraintMol> *)0x177454);
    RVar2 = Molecule::getMass((Molecule *)this_00._M_node);
    in_RDI[10].super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
    _M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         (RVar2 + (double)in_RDI[10].
                          super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>
                          ._M_impl._M_node.super__List_node_base._M_next);
    std::_List_iterator<OpenMD::ZconstraintMol>::operator++
              ((_List_iterator<OpenMD::ZconstraintMol> *)&stack0xfffffffffffffff0);
  }
  return;
}

Assistant:

void ZConstraintForceModifier::calcTotalMassMovingZMols() {
    totMassMovingZMols_ = 0.0;
    std::list<ZconstraintMol>::iterator i;
    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      totMassMovingZMols_ += i->mol->getMass();
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &totMassMovingZMols_, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif
  }